

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorProto_ExtensionRange::MergeFrom
          (DescriptorProto_ExtensionRange *this,DescriptorProto_ExtensionRange *from)

{
  uint uVar1;
  LogMessage *other;
  uint32_t *puVar2;
  ExtensionRangeOptions *this_00;
  ExtensionRangeOptions *from_00;
  LogFinisher local_65;
  uint32_t cached_has_bits;
  byte local_51;
  LogMessage local_50;
  DescriptorProto_ExtensionRange *local_18;
  DescriptorProto_ExtensionRange *from_local;
  DescriptorProto_ExtensionRange *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x944);
    local_51 = 1;
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_65,other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  puVar2 = internal::HasBits<1UL>::operator[](&local_18->_has_bits_,0);
  uVar1 = *puVar2;
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      this_00 = _internal_mutable_options(this);
      from_00 = _internal_options(local_18);
      ExtensionRangeOptions::MergeFrom(this_00,from_00);
    }
    if ((uVar1 & 2) != 0) {
      this->start_ = local_18->start_;
    }
    if ((uVar1 & 4) != 0) {
      this->end_ = local_18->end_;
    }
    puVar2 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
    *puVar2 = uVar1 | *puVar2;
  }
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_,
             &(local_18->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

void DescriptorProto_ExtensionRange::MergeFrom(const DescriptorProto_ExtensionRange& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.DescriptorProto.ExtensionRange)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000007u) {
    if (cached_has_bits & 0x00000001u) {
      _internal_mutable_options()->::PROTOBUF_NAMESPACE_ID::ExtensionRangeOptions::MergeFrom(from._internal_options());
    }
    if (cached_has_bits & 0x00000002u) {
      start_ = from.start_;
    }
    if (cached_has_bits & 0x00000004u) {
      end_ = from.end_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
}